

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::list<double,ft::allocator<double>>::unique<bool(*)(double,double)>
          (list<double,ft::allocator<double>> *this,_func_bool_double_double *binary_pred)

{
  value_type_conflict1 vVar1;
  Node *pNVar2;
  bool bVar3;
  byte bVar4;
  size_type sVar5;
  reference pvVar6;
  listIterator<double> local_78;
  undefined1 local_68 [24];
  iterator prev;
  undefined1 local_28 [8];
  iterator it;
  _func_bool_double_double *binary_pred_local;
  list<double,_ft::allocator<double>_> *this_local;
  
  it.m_node = (Node *)binary_pred;
  sVar5 = list<double,_ft::allocator<double>_>::size((list<double,_ft::allocator<double>_> *)this);
  if (1 < sVar5) {
    list<double,_ft::allocator<double>_>::begin((list<double,_ft::allocator<double>_> *)local_28);
    listIterator<double>::operator++((listIterator<double> *)local_28);
    while( true ) {
      list<double,_ft::allocator<double>_>::end
                ((list<double,_ft::allocator<double>_> *)&prev.m_node);
      bVar3 = operator!=((listIterator<double> *)local_28,(listIterator<double> *)&prev.m_node);
      listIterator<double>::~listIterator((listIterator<double> *)&prev.m_node);
      if (!bVar3) break;
      listIterator<double>::listIterator
                ((listIterator<double> *)(local_68 + 0x10),(listIterator<double> *)local_28);
      listIterator<double>::operator--((listIterator<double> *)(local_68 + 0x10));
      pNVar2 = it.m_node;
      pvVar6 = listIterator<double>::operator*((listIterator<double> *)local_28);
      vVar1 = *pvVar6;
      pvVar6 = listIterator<double>::operator*((listIterator<double> *)(local_68 + 0x10));
      bVar4 = (*(code *)pNVar2)(vVar1,*pvVar6);
      if ((bVar4 & 1) == 0) {
        listIterator<double>::operator++((listIterator<double> *)local_28);
      }
      else {
        listIterator<double>::listIterator(&local_78,(listIterator<double> *)local_28);
        list<double,_ft::allocator<double>_>::erase
                  ((list<double,_ft::allocator<double>_> *)local_68,(iterator *)this);
        listIterator<double>::operator=
                  ((listIterator<double> *)local_28,(listIterator<double> *)local_68);
        listIterator<double>::~listIterator((listIterator<double> *)local_68);
        listIterator<double>::~listIterator(&local_78);
      }
      listIterator<double>::~listIterator((listIterator<double> *)(local_68 + 0x10));
    }
    listIterator<double>::~listIterator((listIterator<double> *)local_28);
  }
  return;
}

Assistant:

void unique(BinaryPredicate binary_pred) {
		if (this->size() <= 1)
			return ;
		iterator	it = this->begin();
		++it;
		while (it != this->end()) {
			iterator	prev = it;
			--prev;
			if (binary_pred(*it, *prev))
				it = this->erase(it);
			else
				++it;
		}
	}